

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::MinkowskiSum(Path *pattern,Path *path,Paths *solution,bool pathIsClosed)

{
  undefined1 local_140 [8];
  Clipper c;
  bool pathIsClosed_local;
  Paths *solution_local;
  Path *path_local;
  Path *pattern_local;
  
  c._279_1_ = pathIsClosed;
  Minkowski(pattern,path,solution,true,pathIsClosed);
  Clipper::Clipper((Clipper *)local_140,0);
  ClipperBase::AddPaths
            ((ClipperBase *)(local_140 + (long)*(_func_int **)((long)local_140 + -0x18)),solution,
             ptSubject,true);
  Clipper::Execute((Clipper *)local_140,ctUnion,solution,pftNonZero,pftNonZero);
  Clipper::~Clipper((Clipper *)local_140);
  return;
}

Assistant:

void MinkowskiSum(const Path& pattern, const Path& path, Paths& solution, bool pathIsClosed)
{
  Minkowski(pattern, path, solution, true, pathIsClosed);
  Clipper c;
  c.AddPaths(solution, ptSubject, true);
  c.Execute(ctUnion, solution, pftNonZero, pftNonZero);
}